

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_0::SyncTest::SyncTest
          (SyncTest *this,EglTestContext *eglTestCtx,EGLenum syncType,Extension extensions,
          bool useCurrentContext,char *name,char *description)

{
  char *name_local;
  bool useCurrentContext_local;
  Extension extensions_local;
  EGLenum syncType_local;
  EglTestContext *eglTestCtx_local;
  SyncTest *this_local;
  
  egl::TestCase::TestCase(&this->super_TestCase,eglTestCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_03268390;
  this->m_syncType = syncType;
  this->m_extensions = extensions;
  this->m_useCurrentContext = useCurrentContext;
  glw::Functions::Functions(&this->m_gl);
  this->m_eglDisplay = (EGLDisplay)0x0;
  this->m_eglSurface = (EGLSurface)0x0;
  this->m_nativeWindow = (NativeWindow *)0x0;
  this->m_eglContext = (EGLContext)0x0;
  this->m_sync = (EGLSyncKHR)0x0;
  return;
}

Assistant:

SyncTest::SyncTest (EglTestContext& eglTestCtx, EGLenum syncType, Extension extensions,  bool useCurrentContext, const char* name, const char* description)
	: TestCase				(eglTestCtx, name, description)
	, m_syncType			(syncType)
	, m_extensions			(extensions)
	, m_useCurrentContext	(useCurrentContext)
	, m_eglDisplay			(EGL_NO_DISPLAY)
	, m_eglSurface			(EGL_NO_SURFACE)
	, m_nativeWindow		(DE_NULL)
	, m_eglContext			(EGL_NO_CONTEXT)
	, m_sync				(EGL_NO_SYNC_KHR)
{
}